

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

bool str2num(SQChar *s,SQObjectPtr *res,SQInteger base)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  longlong x;
  double dVar4;
  SQChar *end;
  SQChar *local_20;
  
  pbVar3 = (byte *)s;
  do {
    bVar1 = *pbVar3;
    if (bVar1 == 0) {
      x = strtoll(s,&local_20,(int)base);
      if (local_20 == s) goto LAB_0012d03e;
      SQObjectPtr::operator=(res,x);
      goto LAB_0012d03a;
    }
  } while ((bVar1 != 0x2e) && (pbVar3 = pbVar3 + 1, (bVar1 & 0xdf) != 0x45 || 0xd < base));
  dVar4 = strtod(s,&local_20);
  if (local_20 == s) {
LAB_0012d03e:
    bVar2 = false;
  }
  else {
    SQObjectPtr::operator=(res,(float)dVar4);
LAB_0012d03a:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

static bool str2num(const SQChar *s,SQObjectPtr &res,SQInteger base)
{
    SQChar *end;
    const SQChar *e = s;
    bool iseintbase = base > 13; //to fix error converting hexadecimals with e like 56f0791e
    bool isfloat = false;
    SQChar c;
    while((c = *e) != _SC('\0'))
    {
        if (c == _SC('.') || (!iseintbase && (c == _SC('E') || c == _SC('e')))) { //e and E is for scientific notation
            isfloat = true;
            break;
        }
        e++;
    }
    if(isfloat){
        SQFloat r = SQFloat(scstrtod(s,&end));
        if(s == end) return false;
        res = r;
    }
    else{
        SQInteger r = SQInteger(scstrtol(s,&end,(int)base));
        if(s == end) return false;
        res = r;
    }
    return true;
}